

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O1

void __thiscall
DescriptorKeyInfo_GetExtPubkeyInformation_root_Test::
~DescriptorKeyInfo_GetExtPubkeyInformation_root_Test
          (DescriptorKeyInfo_GetExtPubkeyInformation_root_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, GetExtPubkeyInformation_root) {
  std::string extkey = "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy";
  ExtPubkey pubkey(extkey);
  std::string path = "m/0/1";
  std::string ext_str = "[00000000]";
  std::string ext_path_str = "[00000000/0/1]";
  std::string key_str;

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, ""));
  EXPECT_STREQ(key_str.c_str(), ext_str.c_str());

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, path));
  EXPECT_STREQ(key_str.c_str(), ext_path_str.c_str());
}